

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# progress.c
# Opt level: O3

_Bool progress_calc(Curl_easy *data,curltime now)

{
  int iVar1;
  long lVar2;
  undefined1 auVar3 [12];
  undefined8 uVar4;
  undefined4 uVar5;
  ulong uVar6;
  ulong uVar7;
  timediff_t tVar8;
  long lVar9;
  ulong uVar10;
  long lVar11;
  long lVar12;
  ulong uVar13;
  int iVar14;
  ulong uVar15;
  curltime newer;
  curltime newer_00;
  curltime older;
  curltime older_00;
  
  lVar12 = now.tv_sec;
  uVar4 = (data->progress).start.tv_sec;
  uVar5 = (data->progress).start.tv_usec;
  older.tv_usec = uVar5;
  older.tv_sec = uVar4;
  auVar3 = now._0_12_;
  newer._12_4_ = 0;
  newer.tv_sec = auVar3._0_8_;
  newer.tv_usec = auVar3._8_4_;
  older._12_4_ = 0;
  uVar6 = Curl_timediff_us(newer,older);
  (data->progress).timespent = uVar6;
  uVar15 = (data->progress).dl.cur_size;
  if ((long)uVar6 < 1) {
    uVar7 = uVar15 * 1000000;
    (data->progress).dl.speed = uVar7;
    uVar13 = (data->progress).ul.cur_size;
    uVar10 = uVar13 * 1000000;
  }
  else {
    uVar10 = 0x7fffffffffffffff;
    if ((long)uVar15 < 0x8637bd05af6) {
      uVar7 = (long)(uVar15 * 1000000) / (long)uVar6;
    }
    else {
      uVar7 = 0x7fffffffffffffff;
      if (999999 < uVar6) {
        uVar7 = uVar15 / (uVar6 / 1000000);
      }
    }
    (data->progress).dl.speed = uVar7;
    uVar13 = (data->progress).ul.cur_size;
    if ((long)uVar13 < 0x8637bd05af6) {
      uVar10 = (long)(uVar13 * 1000000) / (long)uVar6;
    }
    else if (999999 < uVar6) {
      uVar10 = uVar13 / (uVar6 / 1000000);
    }
  }
  (data->progress).ul.speed = uVar10;
  lVar2 = (data->progress).lastshow;
  if (lVar2 != lVar12) {
    iVar1 = (data->progress).speeder_c;
    iVar14 = iVar1 % 6;
    (data->progress).lastshow = lVar12;
    (data->progress).speeder[iVar14] = uVar13 + uVar15;
    (data->progress).speeder_time[iVar14].tv_sec = lVar12;
    (data->progress).speeder_time[iVar14].tv_usec = now.tv_usec;
    (data->progress).speeder_c = iVar1 + 1U;
    if (iVar1 == 0) {
      lVar11 = uVar10 + uVar7;
    }
    else {
      uVar15 = 0;
      if (4 < iVar1) {
        uVar15 = (ulong)((iVar1 + 1U) % 6);
      }
      uVar6 = (ulong)(uint)((int)uVar15 << 4);
      newer_00._12_4_ = 0;
      newer_00.tv_sec = auVar3._0_8_;
      newer_00.tv_usec = auVar3._8_4_;
      older_00.tv_usec = *(undefined4 *)((long)&(data->progress).speeder_time[0].tv_usec + uVar6);
      older_00.tv_sec = *(undefined8 *)((long)&(data->progress).speeder_time[0].tv_sec + uVar6);
      older_00._12_4_ = 0;
      tVar8 = Curl_timediff(newer_00,older_00);
      lVar11 = tVar8 + (ulong)(tVar8 == 0);
      lVar9 = (data->progress).speeder[iVar14] - (data->progress).speeder[uVar15];
      if (lVar9 < 0x418938) {
        lVar11 = (lVar9 * 1000) / lVar11;
      }
      else {
        lVar11 = (long)((double)lVar9 / ((double)lVar11 / 1000.0));
      }
    }
    (data->progress).current_speed = lVar11;
  }
  return lVar2 != lVar12;
}

Assistant:

static bool progress_calc(struct Curl_easy *data, struct curltime now)
{
  bool timetoshow = FALSE;
  struct Progress * const p = &data->progress;

  /* The time spent so far (from the start) in microseconds */
  p->timespent = Curl_timediff_us(now, p->start);
  p->dl.speed = trspeed(p->dl.cur_size, p->timespent);
  p->ul.speed = trspeed(p->ul.cur_size, p->timespent);

  /* Calculations done at most once a second, unless end is reached */
  if(p->lastshow != now.tv_sec) {
    int countindex; /* amount of seconds stored in the speeder array */
    int nowindex = p->speeder_c% CURR_TIME;
    p->lastshow = now.tv_sec;
    timetoshow = TRUE;

    /* Let's do the "current speed" thing, with the dl + ul speeds
       combined. Store the speed at entry 'nowindex'. */
    p->speeder[ nowindex ] = p->dl.cur_size + p->ul.cur_size;

    /* remember the exact time for this moment */
    p->speeder_time [ nowindex ] = now;

    /* advance our speeder_c counter, which is increased every time we get
       here and we expect it to never wrap as 2^32 is a lot of seconds! */
    p->speeder_c++;

    /* figure out how many index entries of data we have stored in our speeder
       array. With N_ENTRIES filled in, we have about N_ENTRIES-1 seconds of
       transfer. Imagine, after one second we have filled in two entries,
       after two seconds we have filled in three entries etc. */
    countindex = ((p->speeder_c >= CURR_TIME) ? CURR_TIME : p->speeder_c) - 1;

    /* first of all, we do not do this if there is no counted seconds yet */
    if(countindex) {
      int checkindex;
      timediff_t span_ms;
      curl_off_t amount;

      /* Get the index position to compare with the 'nowindex' position.
         Get the oldest entry possible. While we have less than CURR_TIME
         entries, the first entry will remain the oldest. */
      checkindex = (p->speeder_c >= CURR_TIME) ? p->speeder_c%CURR_TIME : 0;

      /* Figure out the exact time for the time span */
      span_ms = Curl_timediff(now, p->speeder_time[checkindex]);
      if(0 == span_ms)
        span_ms = 1; /* at least one millisecond MUST have passed */

      /* Calculate the average speed the last 'span_ms' milliseconds */
      amount = p->speeder[nowindex]- p->speeder[checkindex];

      if(amount > CURL_OFF_T_C(4294967) /* 0xffffffff/1000 */)
        /* the 'amount' value is bigger than would fit in 32 bits if
           multiplied with 1000, so we use the double math for this */
        p->current_speed = (curl_off_t)
          ((double)amount/((double)span_ms/1000.0));
      else
        /* the 'amount' value is small enough to fit within 32 bits even
           when multiplied with 1000 */
        p->current_speed = amount*CURL_OFF_T_C(1000)/span_ms;
    }
    else
      /* the first second we use the average */
      p->current_speed = p->ul.speed + p->dl.speed;

  } /* Calculations end */
  return timetoshow;
}